

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O3

PrimitiveSymbol * slang::ast::PrimitiveSymbol::fromSyntax(Scope *scope,UdpDeclarationSyntax *syntax)

{
  span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL> *psVar1;
  Token *this;
  SyntaxKind SVar2;
  Compilation *args;
  UdpBodySyntax *pUVar3;
  long lVar4;
  UdpInitialStmtSyntax *this_00;
  Type *this_01;
  size_t sVar5;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_00;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_01;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_02;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_03;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_04;
  undefined1 auVar6 [12];
  undefined1 auVar7 [16];
  Token TVar8;
  pointer ppPVar9;
  bool bVar10;
  logic_t lVar11;
  logic_t lVar12;
  int iVar13;
  bitwidth_t bVar14;
  PrimitiveSymbol *this_02;
  UdpPortDeclSyntax *pUVar15;
  UdpOutputPortDeclSyntax *pUVar16;
  SourceLocation SVar17;
  PrimitivePortSymbol *pPVar18;
  UdpInputPortDeclSyntax *pUVar19;
  IdentifierNameSyntax *pIVar20;
  NonAnsiUdpPortListSyntax *pNVar21;
  iterator iVar22;
  PrimitiveSymbol *pPVar23;
  undefined4 extraout_var;
  Diagnostic *pDVar24;
  Expression *this_03;
  variant_alternative_t<1UL,_variant<monostate,_SVInt,_real_t,_shortreal_t,_NullPlaceholder,_vector<ConstantValue,_allocator<ConstantValue>_>,_basic_string<char>,_CopyPtr<AssociativeArray>,_CopyPtr<SVQueue>,_CopyPtr<SVUnion>,_UnboundedPlaceholder>_>
  *this_04;
  size_t __n;
  logic_error *this_05;
  long *plVar25;
  Info *pIVar26;
  long lVar27;
  size_type *psVar28;
  long *plVar29;
  char *pcVar30;
  bitmask<slang::ast::ASTFlags> *pbVar31;
  EVP_PKEY_CTX *extraout_RDX;
  EVP_PKEY_CTX *extraout_RDX_00;
  EVP_PKEY_CTX *extraout_RDX_01;
  EVP_PKEY_CTX *extraout_RDX_02;
  EVP_PKEY_CTX *extraout_RDX_03;
  EVP_PKEY_CTX *extraout_RDX_04;
  EVP_PKEY_CTX *extraout_RDX_05;
  EVP_PKEY_CTX *extraout_RDX_06;
  size_type extraout_RDX_07;
  EVP_PKEY_CTX *extraout_RDX_08;
  EVP_PKEY_CTX *extraout_RDX_09;
  EVP_PKEY_CTX *extraout_RDX_10;
  EVP_PKEY_CTX *extraout_RDX_11;
  EVP_PKEY_CTX *extraout_RDX_12;
  EVP_PKEY_CTX *extraout_RDX_13;
  EVP_PKEY_CTX *extraout_RDX_14;
  EVP_PKEY_CTX *extraout_RDX_15;
  EVP_PKEY_CTX *extraout_RDX_16;
  EVP_PKEY_CTX *extraout_RDX_17;
  EVP_PKEY_CTX *src;
  EVP_PKEY_CTX *extraout_RDX_18;
  ulong uVar32;
  DiagCode code;
  size_t sVar33;
  char cVar34;
  SyntaxNode *pSVar35;
  size_type __rlen;
  long lVar36;
  SourceRange SVar37;
  string_view sVar38;
  PrimitivePortSymbol *port;
  PrimitivePortSymbol *port_1;
  PrimitivePortSymbol *port_2;
  SmallVector<const_slang::ast::PrimitivePortSymbol_*,_5UL> ports;
  Token name;
  undefined1 local_228 [8];
  undefined8 uStack_220;
  long local_218;
  long lStack_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  UdpOutputPortDeclSyntax *local_1e0;
  UdpDeclarationSyntax *local_1d8;
  ulong local_1d0;
  AnsiUdpPortListSyntax *local_1c8;
  UdpPortDeclSyntax *local_1c0;
  Compilation *local_1b8;
  size_t local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  SourceLocation local_188 [2];
  undefined1 local_178 [16];
  SmallVectorBase<const_slang::ast::PrimitivePortSymbol_*> local_168 [2];
  undefined1 local_128 [16];
  bitmask<slang::ast::ASTFlags> local_118;
  Symbol *pSStack_110;
  TempVarSymbol *local_108;
  RandomizeDetails *pRStack_100;
  AssertionInstanceDetails *local_f8;
  StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>_>,_4UL>
  *local_a8;
  sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>_>,_4UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>_>,_4UL>_>
  local_a0;
  string local_78;
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_58;
  undefined4 extraout_var_00;
  
  args = scope->compilation;
  local_128 = (undefined1  [16])parsing::Token::valueText(&syntax->name);
  local_168[0].data_ = (pointer)parsing::Token::location(&syntax->name);
  auVar7._12_4_ = 0;
  auVar7._0_12_ = stack0xfffffffffffffddc;
  _local_228 = (Token)(auVar7 << 0x20);
  local_1b8 = args;
  this_02 = BumpAllocator::
            emplace<slang::ast::PrimitiveSymbol,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation,slang::ast::PrimitiveSymbol::PrimitiveKind>
                      (&args->super_BumpAllocator,args,
                       (basic_string_view<char,_std::char_traits<char>_> *)local_128,
                       (SourceLocation *)local_168,(PrimitiveKind *)local_228);
  psVar1 = &(syntax->super_MemberSyntax).attributes.
            super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>;
  syntax_00.data_ = psVar1->data_;
  syntax_00.size_ = psVar1->size_;
  if ((syntax->super_MemberSyntax).attributes.
      super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.size_ != 0 &&
      psVar1->data_ == (pointer)0x0) {
    std::terminate();
  }
  Symbol::setAttributes(&this_02->super_Symbol,scope,syntax_00);
  (this_02->super_Symbol).originatingSyntax = (SyntaxNode *)syntax;
  local_168[0].data_ = (pointer)local_168[0].firstElement;
  local_168[0].len = 0;
  local_168[0].cap = 5;
  pSVar35 = &((syntax->portList).ptr)->super_SyntaxNode;
  local_1d8 = syntax;
  if (pSVar35 == (SyntaxNode *)0x0) {
    pcVar30 = 
    "T slang::not_null<slang::syntax::UdpPortListSyntax *>::get() const [T = slang::syntax::UdpPortListSyntax *]"
    ;
LAB_001ce2de:
    assert::assertFailed
              ("ptr",
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
               ,0x26,pcVar30);
  }
  SVar2 = pSVar35->kind;
  src = extraout_RDX;
  if (SVar2 != WildcardUdpPortList) {
    if (SVar2 == NonAnsiUdpPortList) {
      local_a8 = (StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>_>,_4UL>
                  *)local_128;
      local_a0.
      super_StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>_>,_4UL>
      .storage = (StackAllocStorage<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>_>,_4UL>
                  *)local_128;
      local_a0.entries =
           ska::detailv3::
           empty_default_table<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PrimitivePortSymbol*>>
                     ();
      local_a0.num_slots_minus_one = 0;
      local_a0.hash_policy.shift = '?';
      local_a0.max_lookups = '\x03';
      local_a0._max_load_factor = 0.5;
      local_a0.num_elements = 0;
      pSVar35 = &((local_1d8->portList).ptr)->super_SyntaxNode;
      if (pSVar35 == (SyntaxNode *)0x0) {
        assert::assertFailed
                  ("ptr",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
                   ,0x26,
                   "T slang::not_null<slang::syntax::UdpPortListSyntax *>::get() const [T = slang::syntax::UdpPortListSyntax *]"
                  );
      }
      pNVar21 = slang::syntax::SyntaxNode::as<slang::syntax::NonAnsiUdpPortListSyntax>(pSVar35);
      uVar32 = (pNVar21->ports).elements.size_ + 1;
      if (1 < uVar32) {
        sVar33 = 0;
        do {
          pIVar20 = slang::syntax::SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax>::
                    operator[](&pNVar21->ports,sVar33);
          _local_228 = pIVar20->identifier;
          local_208._0_16_ = parsing::Token::valueText((Token *)local_228);
          local_188[0] = parsing::Token::location((Token *)local_228);
          local_78._M_dataplus._M_p._0_4_ = 0;
          local_1a8._M_dataplus._M_p =
               (pointer)BumpAllocator::
                        emplace<slang::ast::PrimitivePortSymbol,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation,slang::ast::PrimitivePortDirection>
                                  (&local_1b8->super_BumpAllocator,local_1b8,
                                   (basic_string_view<char,_std::char_traits<char>_> *)&local_208,
                                   local_188,(PrimitivePortDirection *)&local_78);
          SmallVectorBase<slang::ast::PrimitivePortSymbol_const*>::
          emplace_back<slang::ast::PrimitivePortSymbol_const*const&>
                    ((SmallVectorBase<slang::ast::PrimitivePortSymbol_const*> *)local_168,
                     (PrimitivePortSymbol **)&local_1a8);
          Scope::addMember(&this_02->super_Scope,(Symbol *)local_1a8._M_dataplus._M_p);
          sVar38 = parsing::Token::valueText((Token *)local_228);
          if (sVar38._M_len != 0) {
            local_208._0_16_ = parsing::Token::valueText((Token *)local_228);
            ska::detailv3::
            sherwood_v3_table<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PrimitivePortSymbol*>,std::basic_string_view<char,std::char_traits<char>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PrimitivePortSymbol*>,std::hash<std::basic_string_view<char,std::char_traits<char>>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PrimitivePortSymbol*>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PrimitivePortSymbol*>>,4ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PrimitivePortSymbol*>>,4ul>>
            ::
            emplace<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PrimitivePortSymbol*&>
                      ((sherwood_v3_table<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PrimitivePortSymbol*>,std::basic_string_view<char,std::char_traits<char>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PrimitivePortSymbol*>,std::hash<std::basic_string_view<char,std::char_traits<char>>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PrimitivePortSymbol*>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PrimitivePortSymbol*>>,4ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PrimitivePortSymbol*>>,4ul>>
                        *)&local_a0,(basic_string_view<char,_std::char_traits<char>_> *)&local_208,
                       (PrimitivePortSymbol **)&local_1a8);
          }
          sVar33 = sVar33 + 1;
        } while (uVar32 >> 1 != sVar33);
      }
      pUVar3 = (local_1d8->body).ptr;
      if (pUVar3 == (UdpBodySyntax *)0x0) {
        assert::assertFailed
                  ("ptr",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
                   ,0x26,
                   "T slang::not_null<slang::syntax::UdpBodySyntax *>::get() const [T = slang::syntax::UdpBodySyntax *]"
                  );
      }
      uVar32 = (pUVar3->portDecls).elements.size_ + 1;
      if (1 < uVar32) {
        local_1c8 = (AnsiUdpPortListSyntax *)&pUVar3->portDecls;
        local_1d0 = uVar32 >> 1;
        local_1e0 = (UdpOutputPortDeclSyntax *)0x0;
        sVar33 = 0;
        do {
          local_1b0 = sVar33;
          pUVar15 = slang::syntax::SeparatedSyntaxList<slang::syntax::UdpPortDeclSyntax>::operator[]
                              ((SeparatedSyntaxList<slang::syntax::UdpPortDeclSyntax> *)local_1c8,
                               sVar33);
          if ((pUVar15->super_SyntaxNode).kind == UdpOutputPortDecl) {
            pUVar16 = slang::syntax::SyntaxNode::as<slang::syntax::UdpOutputPortDeclSyntax>
                                (&pUVar15->super_SyntaxNode);
            this = &pUVar16->name;
            _local_228 = (Token)parsing::Token::valueText(this);
            iVar22 = ska::detailv3::
                     sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>_>,_4UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>_>,_4UL>_>
                     ::find(&local_a0,(basic_string_view<char,_std::char_traits<char>_> *)local_228)
            ;
            if (iVar22.current ==
                local_a0.entries + local_a0.num_slots_minus_one + (long)local_a0.max_lookups) {
              SVar37 = parsing::Token::range(this);
              pDVar24 = Scope::addDiag(scope,(DiagCode)0x800006,SVar37);
              sVar38 = parsing::Token::valueText(this);
              Diagnostic::operator<<(pDVar24,sVar38);
              pUVar16 = local_1e0;
            }
            else {
              pIVar26 = (pUVar16->reg).info;
              if ((pIVar26 == (Info *)0x0) || ((pUVar16->keyword).info != (Info *)0x0)) {
                pPVar18 = ((iVar22.current)->field_1).value.second;
                _local_228 = pUVar16->name;
                if ((pPVar18->super_ValueSymbol).super_Symbol.originatingSyntax != (SyntaxNode *)0x0
                   ) {
                  SVar37 = parsing::Token::range((Token *)local_228);
                  pDVar24 = Scope::addDiag(scope,(DiagCode)0x7e0006,SVar37);
                  sVar38 = parsing::Token::valueText((Token *)local_228);
                  Diagnostic::operator<<(pDVar24,sVar38);
                  Diagnostic::addNote(pDVar24,(DiagCode)0x80001,
                                      (pPVar18->super_ValueSymbol).super_Symbol.location);
                  pIVar26 = (pUVar16->reg).info;
                }
                pPVar18->direction = OutReg - (pIVar26 == (Info *)0x0);
                SVar17 = parsing::Token::location(this);
                (pPVar18->super_ValueSymbol).super_Symbol.location = SVar17;
                (pPVar18->super_ValueSymbol).super_Symbol.originatingSyntax = (SyntaxNode *)pUVar16;
                syntax_04.data_ =
                     (pUVar15->attributes).
                     super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.
                     data_;
                syntax_04.size_ =
                     (pUVar15->attributes).
                     super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.
                     size_;
                Symbol::setAttributes((Symbol *)pPVar18,scope,syntax_04);
                pUVar16 = local_1e0;
              }
              else if (local_1e0 != (UdpOutputPortDeclSyntax *)0x0) {
                SVar37 = parsing::Token::range(&pUVar16->reg);
                pDVar24 = Scope::addDiag(scope,(DiagCode)0x810006,SVar37);
                SVar17 = parsing::Token::location(&local_1e0->reg);
                Diagnostic::addNote(pDVar24,(DiagCode)0x80001,SVar17);
              }
            }
          }
          else {
            local_1c0 = pUVar15;
            pUVar19 = slang::syntax::SyntaxNode::as<slang::syntax::UdpInputPortDeclSyntax>
                                (&pUVar15->super_SyntaxNode);
            uVar32 = (pUVar19->names).elements.size_ + 1;
            pUVar16 = local_1e0;
            if (1 < uVar32) {
              sVar33 = 0;
              do {
                pIVar20 = slang::syntax::SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax>::
                          operator[](&pUVar19->names,sVar33);
                local_208._0_16_ = pIVar20->identifier;
                _local_228 = (Token)parsing::Token::valueText((Token *)&local_208);
                iVar22 = ska::detailv3::
                         sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>_>,_4UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>_>,_4UL>_>
                         ::find(&local_a0,
                                (basic_string_view<char,_std::char_traits<char>_> *)local_228);
                if (iVar22.current ==
                    local_a0.entries + local_a0.num_slots_minus_one + (long)local_a0.max_lookups) {
                  SVar37 = parsing::Token::range((Token *)&local_208);
                  pDVar24 = Scope::addDiag(scope,(DiagCode)0x800006,SVar37);
                  sVar38 = parsing::Token::valueText((Token *)&local_208);
                  Diagnostic::operator<<(pDVar24,sVar38);
                }
                else {
                  pPVar18 = ((iVar22.current)->field_1).value.second;
                  _local_228 = (Token)local_208._0_16_;
                  if ((pPVar18->super_ValueSymbol).super_Symbol.originatingSyntax !=
                      (SyntaxNode *)0x0) {
                    SVar37 = parsing::Token::range((Token *)local_228);
                    pDVar24 = Scope::addDiag(scope,(DiagCode)0x7e0006,SVar37);
                    sVar38 = parsing::Token::valueText((Token *)local_228);
                    Diagnostic::operator<<(pDVar24,sVar38);
                    Diagnostic::addNote(pDVar24,(DiagCode)0x80001,
                                        (pPVar18->super_ValueSymbol).super_Symbol.location);
                  }
                  SVar17 = parsing::Token::location((Token *)&local_208);
                  (pPVar18->super_ValueSymbol).super_Symbol.location = SVar17;
                  (pPVar18->super_ValueSymbol).super_Symbol.originatingSyntax =
                       (SyntaxNode *)pIVar20;
                  syntax_03.data_ =
                       (local_1c0->attributes).
                       super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.
                       data_;
                  syntax_03.size_ =
                       (local_1c0->attributes).
                       super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.
                       size_;
                  Symbol::setAttributes((Symbol *)pPVar18,scope,syntax_03);
                }
                sVar33 = sVar33 + 1;
                pUVar16 = local_1e0;
              } while (uVar32 >> 1 != sVar33);
            }
          }
          local_1e0 = pUVar16;
          sVar33 = local_1b0 + 1;
        } while (sVar33 != local_1d0);
        if (local_1e0 != (UdpOutputPortDeclSyntax *)0x0) {
          local_208._0_16_ = local_1e0->name;
          _local_228 = (Token)parsing::Token::valueText((Token *)&local_208);
          iVar22 = ska::detailv3::
                   sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>_>,_4UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>_>,_4UL>_>
                   ::find(&local_a0,(basic_string_view<char,_std::char_traits<char>_> *)local_228);
          if (iVar22.current ==
              local_a0.entries + local_a0.num_slots_minus_one + (long)local_a0.max_lookups) {
            assert::assertFailed
                      ("it != portMap.end()",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/symbols/MemberSymbols.cpp"
                       ,0x36b,
                       "static PrimitiveSymbol &slang::ast::PrimitiveSymbol::fromSyntax(const Scope &, const UdpDeclarationSyntax &)"
                      );
          }
          pPVar18 = ((iVar22.current)->field_1).value.second;
          if ((pPVar18->super_ValueSymbol).super_Symbol.originatingSyntax != (SyntaxNode *)0x0) {
            if (pPVar18->direction == In) {
              SVar37 = parsing::Token::range((Token *)&local_208);
              pDVar24 = Scope::addDiag(scope,(DiagCode)0x820006,SVar37);
              Diagnostic::operator<<(pDVar24,(pPVar18->super_ValueSymbol).super_Symbol.name);
            }
            else if (pPVar18->direction == OutReg) {
              _local_228 = (Token)local_208._0_16_;
              SVar37 = parsing::Token::range((Token *)local_228);
              pDVar24 = Scope::addDiag(scope,(DiagCode)0x7e0006,SVar37);
              sVar38 = parsing::Token::valueText((Token *)local_228);
              Diagnostic::operator<<(pDVar24,sVar38);
              Diagnostic::addNote(pDVar24,(DiagCode)0x80001,
                                  (pPVar18->super_ValueSymbol).super_Symbol.location);
            }
            else {
              pPVar18->direction = OutReg;
            }
          }
        }
      }
      ppPVar9 = local_168[0].data_;
      if (local_168[0].len != 0) {
        lVar27 = local_168[0].len << 3;
        lVar36 = 0;
        do {
          lVar4 = *(long *)((long)ppPVar9 + lVar36);
          if (*(long *)(lVar4 + 0x38) == 0) {
            pDVar24 = Scope::addDiag(scope,(DiagCode)0x7f0006,*(SourceLocation *)(lVar4 + 0x18));
            Diagnostic::operator<<(pDVar24,*(string_view *)(lVar4 + 8));
          }
          lVar36 = lVar36 + 8;
        } while (lVar27 != lVar36);
      }
      ska::detailv3::
      sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>_>,_4UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>_>,_4UL>_>
      ::~sherwood_v3_table(&local_a0);
      src = extraout_RDX_05;
    }
    else {
      if (SVar2 != AnsiUdpPortList) {
        this_05 = (logic_error *)__cxa_allocate_exception(0x10);
        local_188[0] = (SourceLocation)local_178;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_188,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/symbols/MemberSymbols.cpp"
                   ,"");
        plVar25 = (long *)std::__cxx11::string::append((char *)local_188);
        local_1a8._M_dataplus._M_p = (pointer)*plVar25;
        psVar28 = (size_type *)(plVar25 + 2);
        if ((size_type *)local_1a8._M_dataplus._M_p == psVar28) {
          local_1a8.field_2._M_allocated_capacity = *psVar28;
          local_1a8.field_2._8_8_ = plVar25[3];
          local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
        }
        else {
          local_1a8.field_2._M_allocated_capacity = *psVar28;
        }
        local_1a8._M_string_length = plVar25[1];
        *plVar25 = (long)psVar28;
        plVar25[1] = 0;
        *(undefined1 *)(plVar25 + 2) = 0;
        std::__cxx11::to_string(&local_78,0x387);
        std::operator+(&local_208,&local_1a8,&local_78);
        plVar25 = (long *)std::__cxx11::string::append((char *)&local_208);
        local_228 = (undefined1  [8])*plVar25;
        plVar29 = plVar25 + 2;
        if (local_228 == (undefined1  [8])plVar29) {
          local_218 = *plVar29;
          lStack_210 = plVar25[3];
          local_228 = (undefined1  [8])&local_218;
        }
        else {
          local_218 = *plVar29;
        }
        uStack_220 = (Info *)plVar25[1];
        *plVar25 = (long)plVar29;
        plVar25[1] = 0;
        *(undefined1 *)(plVar25 + 2) = 0;
        plVar25 = (long *)std::__cxx11::string::append(local_228);
        local_128._0_8_ = *plVar25;
        pbVar31 = (bitmask<slang::ast::ASTFlags> *)(plVar25 + 2);
        if ((bitmask<slang::ast::ASTFlags> *)local_128._0_8_ == pbVar31) {
          local_118.m_bits = pbVar31->m_bits;
          pSStack_110 = (Symbol *)plVar25[3];
          local_128._0_8_ = &local_118;
        }
        else {
          local_118.m_bits = pbVar31->m_bits;
        }
        local_128._8_8_ = (Info *)plVar25[1];
        *plVar25 = (long)pbVar31;
        plVar25[1] = 0;
        *(undefined1 *)(plVar25 + 2) = 0;
        std::logic_error::logic_error(this_05,(string *)local_128);
        __cxa_throw(this_05,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      local_1c8 = slang::syntax::SyntaxNode::as<slang::syntax::AnsiUdpPortListSyntax>(pSVar35);
      local_1d0 = (local_1c8->ports).elements.size_ + 1;
      src = extraout_RDX_00;
      if (1 < local_1d0) {
        local_1c8 = (AnsiUdpPortListSyntax *)&local_1c8->ports;
        local_1d0 = local_1d0 >> 1;
        local_1c0 = (UdpPortDeclSyntax *)&this_02->super_Scope;
        sVar33 = 0;
        do {
          local_1b0 = sVar33;
          pUVar15 = slang::syntax::SeparatedSyntaxList<slang::syntax::UdpPortDeclSyntax>::operator[]
                              ((SeparatedSyntaxList<slang::syntax::UdpPortDeclSyntax> *)local_1c8,
                               sVar33);
          if ((pUVar15->super_SyntaxNode).kind == UdpOutputPortDecl) {
            pUVar16 = slang::syntax::SyntaxNode::as<slang::syntax::UdpOutputPortDeclSyntax>
                                (&pUVar15->super_SyntaxNode);
            local_1a8._M_dataplus._M_p._0_4_ = 2 - (uint)((pUVar16->reg).info == (Info *)0x0);
            local_128 = (undefined1  [16])parsing::Token::valueText(&pUVar16->name);
            SVar17 = parsing::Token::location(&pUVar16->name);
            local_208._M_dataplus._M_p = (pointer)SVar17;
            pPVar18 = BumpAllocator::
                      emplace<slang::ast::PrimitivePortSymbol,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation,slang::ast::PrimitivePortDirection&>
                                (&local_1b8->super_BumpAllocator,local_1b8,
                                 (basic_string_view<char,_std::char_traits<char>_> *)local_128,
                                 (SourceLocation *)&local_208,(PrimitivePortDirection *)&local_1a8);
            local_228 = (undefined1  [8])pPVar18;
            (pPVar18->super_ValueSymbol).super_Symbol.originatingSyntax = &pUVar15->super_SyntaxNode
            ;
            syntax_01.data_ =
                 (pUVar15->attributes).
                 super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.data_;
            syntax_01.size_ =
                 (pUVar15->attributes).
                 super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.size_;
            Symbol::setAttributes((Symbol *)pPVar18,scope,syntax_01);
            SmallVectorBase<slang::ast::PrimitivePortSymbol_const*>::
            emplace_back<slang::ast::PrimitivePortSymbol_const*const&>
                      ((SmallVectorBase<slang::ast::PrimitivePortSymbol_const*> *)local_168,
                       (PrimitivePortSymbol **)local_228);
            Scope::addMember((Scope *)local_1c0,(Symbol *)local_228);
            src = extraout_RDX_01;
          }
          else {
            pUVar19 = slang::syntax::SyntaxNode::as<slang::syntax::UdpInputPortDeclSyntax>
                                (&pUVar15->super_SyntaxNode);
            uVar32 = (pUVar19->names).elements.size_ + 1;
            src = extraout_RDX_02;
            if (1 < uVar32) {
              sVar33 = 0;
              do {
                pIVar20 = slang::syntax::SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax>::
                          operator[](&pUVar19->names,sVar33);
                local_128 = *(undefined1 (*) [16])&pIVar20->identifier;
                _local_228 = (Token)parsing::Token::valueText((Token *)local_128);
                local_1a8._M_dataplus._M_p = (pointer)parsing::Token::location((Token *)local_128);
                local_188[0] = (SourceLocation)((ulong)local_188[0] & 0xffffffff00000000);
                pPVar18 = BumpAllocator::
                          emplace<slang::ast::PrimitivePortSymbol,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation,slang::ast::PrimitivePortDirection>
                                    (&local_1b8->super_BumpAllocator,local_1b8,
                                     (basic_string_view<char,_std::char_traits<char>_> *)local_228,
                                     (SourceLocation *)&local_1a8,
                                     (PrimitivePortDirection *)local_188);
                local_208._M_dataplus._M_p = (pointer)pPVar18;
                (pPVar18->super_ValueSymbol).super_Symbol.originatingSyntax = (SyntaxNode *)pIVar20;
                syntax_02.data_ =
                     (pUVar15->attributes).
                     super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.
                     data_;
                syntax_02.size_ =
                     (pUVar15->attributes).
                     super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.
                     size_;
                Symbol::setAttributes((Symbol *)pPVar18,scope,syntax_02);
                SmallVectorBase<slang::ast::PrimitivePortSymbol_const*>::
                emplace_back<slang::ast::PrimitivePortSymbol_const*const&>
                          ((SmallVectorBase<slang::ast::PrimitivePortSymbol_const*> *)local_168,
                           (PrimitivePortSymbol **)&local_208);
                Scope::addMember((Scope *)local_1c0,(Symbol *)local_208._M_dataplus._M_p);
                sVar33 = sVar33 + 1;
                src = extraout_RDX_03;
              } while (uVar32 >> 1 != sVar33);
            }
          }
          sVar33 = local_1b0 + 1;
        } while (sVar33 != local_1d0);
      }
      pUVar3 = (local_1d8->body).ptr;
      if (pUVar3 == (UdpBodySyntax *)0x0) {
        pcVar30 = 
        "T slang::not_null<slang::syntax::UdpBodySyntax *>::get() const [T = slang::syntax::UdpBodySyntax *]"
        ;
        goto LAB_001ce2de;
      }
      if ((pUVar3->portDecls).elements.size_ != 0) {
        pUVar15 = slang::syntax::SeparatedSyntaxList<slang::syntax::UdpPortDeclSyntax>::operator[]
                            (&pUVar3->portDecls,0);
        SVar37 = slang::syntax::SyntaxNode::sourceRange(&pUVar15->super_SyntaxNode);
        Scope::addDiag(scope,(DiagCode)0x770006,SVar37);
        src = extraout_RDX_04;
      }
    }
  }
  code.subsystem = Declarations;
  code.code = 0x83;
  pPVar23 = this_02;
  if (1 < local_168[0].len) {
    pPVar23 = (PrimitiveSymbol *)*local_168[0].data_;
    if (*(int *)&pPVar23->isSequential == 2) {
      this_02->isSequential = true;
      pSVar35 = (pPVar23->super_Symbol).originatingSyntax;
      if ((pSVar35 == (SyntaxNode *)0x0) || (pSVar35->kind != UdpOutputPortDecl)) {
LAB_001cde18:
        pSVar35 = (SyntaxNode *)0x0;
      }
      else {
        pUVar16 = slang::syntax::SyntaxNode::as<slang::syntax::UdpOutputPortDeclSyntax>(pSVar35);
        src = extraout_RDX_08;
        if (pUVar16->initializer == (EqualsValueClauseSyntax *)0x0) goto LAB_001cde18;
        pSVar35 = &((pUVar16->initializer->expr).ptr)->super_SyntaxNode;
        if (pSVar35 == (SyntaxNode *)0x0) {
          assert::assertFailed
                    ("ptr",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
                     ,0x26,
                     "T slang::not_null<slang::syntax::ExpressionSyntax *>::get() const [T = slang::syntax::ExpressionSyntax *]"
                    );
        }
      }
      if (1 < local_168[0].len) {
        lVar27 = 1;
        do {
          if (*(int *)(*(long *)((long)local_168[0].data_ + lVar27 * 8) + 0x88) != 0) {
            Scope::addDiag(scope,(DiagCode)0x790006,
                           *(SourceLocation *)
                            (*(long *)((long)local_168[0].data_ + lVar27 * 8) + 0x18));
            src = extraout_RDX_09;
            break;
          }
          lVar27 = lVar27 + 1;
          src = (EVP_PKEY_CTX *)local_168[0].data_;
        } while (local_168[0].len != lVar27);
      }
      pUVar3 = (local_1d8->body).ptr;
      if (pUVar3 == (UdpBodySyntax *)0x0) {
        pcVar30 = 
        "T slang::not_null<slang::syntax::UdpBodySyntax *>::get() const [T = slang::syntax::UdpBodySyntax *]"
        ;
LAB_001ce2bf:
        assert::assertFailed
                  ("ptr",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
                   ,0x26,pcVar30);
      }
      this_00 = pUVar3->initialStmt;
      if (this_00 == (UdpInitialStmtSyntax *)0x0) {
LAB_001cdefe:
        if (pSVar35 == (SyntaxNode *)0x0) goto LAB_001cdd71;
      }
      else {
        if (this_02->isSequential == false) {
          SVar37 = slang::syntax::SyntaxNode::sourceRange(&this_00->super_SyntaxNode);
          Scope::addDiag(scope,(DiagCode)0x7b0006,SVar37);
          src = extraout_RDX_10;
          goto LAB_001cdefe;
        }
        if (pSVar35 == (SyntaxNode *)0x0) {
          pSVar35 = &((this_00->value).ptr)->super_SyntaxNode;
          if (pSVar35 == (SyntaxNode *)0x0) {
            pcVar30 = 
            "T slang::not_null<slang::syntax::ExpressionSyntax *>::get() const [T = slang::syntax::ExpressionSyntax *]"
            ;
            goto LAB_001ce2bf;
          }
          sVar38 = parsing::Token::valueText(&this_00->name);
          __n = sVar38._M_len;
          if (__n != 0) {
            if (local_168[0].len == 0) {
              assert::assertFailed
                        ("index < len",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/SmallVector.h"
                         ,0x196,
                         "reference slang::SmallVectorBase<const slang::ast::PrimitivePortSymbol *>::operator[](size_type) [T = const slang::ast::PrimitivePortSymbol *]"
                        );
            }
            sVar5 = *(size_t *)((long)*local_168[0].data_ + 8);
            if (sVar5 != 0) {
              if (__n == sVar5) {
                iVar13 = bcmp(sVar38._M_str,*(void **)((long)*local_168[0].data_ + 0x10),__n);
                if (iVar13 == 0) goto LAB_001cdf07;
              }
              SVar37 = parsing::Token::range(&this_00->name);
              pDVar24 = Scope::addDiag(scope,(DiagCode)0x840006,SVar37);
              Diagnostic::operator<<(pDVar24,sVar38);
              if (local_168[0].len == 0) {
                assert::assertFailed
                          ("index < len",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/SmallVector.h"
                           ,0x196,
                           "reference slang::SmallVectorBase<const slang::ast::PrimitivePortSymbol *>::operator[](size_type) [T = const slang::ast::PrimitivePortSymbol *]"
                          );
              }
              Diagnostic::addNote(pDVar24,(DiagCode)0x40001,
                                  *(SourceLocation *)((long)*local_168[0].data_ + 0x18));
            }
          }
        }
        else {
          SVar37 = slang::syntax::SyntaxNode::sourceRange(&this_00->super_SyntaxNode);
          pDVar24 = Scope::addDiag(scope,(DiagCode)0x780006,SVar37);
          local_128 = (undefined1  [16])slang::syntax::SyntaxNode::getFirstToken(pSVar35);
          SVar17 = parsing::Token::location((Token *)local_128);
          Diagnostic::addNote(pDVar24,(DiagCode)0x80001,SVar17);
        }
      }
LAB_001cdf07:
      local_128._8_4_ = 0xffffffff;
      local_128._0_8_ = scope;
      local_118.m_bits = 0;
      pSStack_110 = (Symbol *)0x0;
      local_108 = (TempVarSymbol *)0x0;
      pRStack_100 = (RandomizeDetails *)0x0;
      local_f8 = (AssertionInstanceDetails *)0x0;
      iVar13 = Expression::bind((int)pSVar35,(sockaddr *)local_128,0);
      this_03 = (Expression *)CONCAT44(extraout_var_00,iVar13);
      bVar10 = Expression::bad(this_03);
      src = extraout_RDX_11;
      if (!bVar10) {
        if (this_03->kind == IntegerLiteral) {
          this_01 = (this_03->type).ptr;
          if (this_01 == (Type *)0x0) {
            assert::assertFailed
                      ("ptr",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
                       ,0x26,
                       "T slang::not_null<const slang::ast::Type *>::get() const [T = const slang::ast::Type *]"
                      );
          }
          bVar14 = Type::getBitWidth(this_01);
          if ((bVar14 == 1) ||
             (bVar10 = Expression::isUnsizedInteger(this_03), src = extraout_RDX_12, bVar10)) {
            ASTContext::eval((ConstantValue *)&local_58,(ASTContext *)local_128,this_03,
                             (bitmask<slang::ast::EvalFlags>)0x0);
            std::__detail::__variant::
            _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
            ::~_Variant_storage(&local_58);
            src = extraout_RDX_13;
            if (&this_03->constant->value !=
                (variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                 *)0x0) {
              this_04 = std::
                        get<1ul,std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                                  (&this_03->constant->value);
              _local_228 = ZEXT814(0) << 0x30;
              TVar8 = _local_228;
              auVar6._8_4_ = 0;
              auVar6._0_8_ = uStack_220;
              _local_228 = auVar6 << 0x40;
              uStack_220._5_3_ = TVar8.info._5_3_;
              uStack_220._4_1_ = 1;
              _local_228 = ZEXT412(1) << 0x40;
              SVInt::clearUnusedBits((SVInt *)local_228);
              lVar11 = SVInt::operator==(this_04,(SVInt *)local_228);
              local_208._M_string_length._0_4_ = 2;
              local_208._M_dataplus._M_p = (pointer)0x1;
              local_208._M_string_length._4_4_ = 0;
              SVInt::clearUnusedBits((SVInt *)&local_208);
              lVar12 = SVInt::operator==(this_04,(SVInt *)&local_208);
              bVar10 = false;
              cVar34 = -0x80;
              if (lVar12.value == '\0' && lVar11.value == '\0') {
                cVar34 = '\0';
              }
              if (lVar12.value == '\x01') {
                cVar34 = '\x01';
              }
              if (lVar11.value == '\x01') {
                cVar34 = '\x01';
              }
              src = extraout_RDX_14;
              if ((this_04->super_SVIntStorage).bitWidth == 1) {
                lVar11 = SVInt::operator[](this_04,0);
                bVar10 = lVar11.value == 0x80;
                src = extraout_RDX_15;
              }
              if (((0x40 < (uint)local_208._M_string_length) ||
                  (((undefined1  [16])local_208._0_16_ & (undefined1  [16])0x10000000000) !=
                   (undefined1  [16])0x0)) && (local_208._M_dataplus._M_p != (pointer)0x0)) {
                operator_delete__(local_208._M_dataplus._M_p);
                src = extraout_RDX_16;
              }
              if (((0x40 < (uint)uStack_220) ||
                  (((undefined1  [16])_local_228 & (undefined1  [16])0x10000000000) !=
                   (undefined1  [16])0x0)) && (local_228 != (undefined1  [8])0x0)) {
                operator_delete__((void *)local_228);
                src = extraout_RDX_17;
              }
              if (bVar10 || cVar34 != '\0' && (cVar34 != '@' && cVar34 != -0x80)) {
                this_02->initVal = this_03->constant;
              }
            }
          }
        }
        if (this_02->initVal == (ConstantValue *)0x0) {
          Scope::addDiag(scope,(DiagCode)0x7a0006,this_03->sourceRange);
          src = extraout_RDX_18;
        }
      }
      goto LAB_001cdd71;
    }
    code.subsystem = Declarations;
    code.code = 0x7c;
    if (*(int *)&pPVar23->isSequential != 0) goto LAB_001cde18;
  }
  Scope::addDiag(scope,code,(pPVar23->super_Symbol).location);
  src = extraout_RDX_06;
LAB_001cdd71:
  iVar13 = SmallVectorBase<const_slang::ast::PrimitivePortSymbol_*>::copy
                     (local_168,(EVP_PKEY_CTX *)local_1b8,src);
  (this_02->ports).data_ = (pointer)CONCAT44(extraout_var,iVar13);
  (this_02->ports).size_ = extraout_RDX_07;
  if (local_168[0].data_ != (pointer)local_168[0].firstElement) {
    free(local_168[0].data_);
  }
  return this_02;
}

Assistant:

PrimitiveSymbol& PrimitiveSymbol::fromSyntax(const Scope& scope,
                                             const UdpDeclarationSyntax& syntax) {
    auto& comp = scope.getCompilation();
    auto prim = comp.emplace<PrimitiveSymbol>(comp, syntax.name.valueText(), syntax.name.location(),
                                              PrimitiveSymbol::UserDefined);
    prim->setAttributes(scope, syntax.attributes);
    prim->setSyntax(syntax);

    SmallVector<const PrimitivePortSymbol*> ports;
    if (syntax.portList->kind == SyntaxKind::AnsiUdpPortList) {
        for (auto decl : syntax.portList->as<AnsiUdpPortListSyntax>().ports) {
            if (decl->kind == SyntaxKind::UdpOutputPortDecl) {
                auto& outputDecl = decl->as<UdpOutputPortDeclSyntax>();
                PrimitivePortDirection dir = PrimitivePortDirection::Out;
                if (outputDecl.reg)
                    dir = PrimitivePortDirection::OutReg;

                auto port = comp.emplace<PrimitivePortSymbol>(comp, outputDecl.name.valueText(),
                                                              outputDecl.name.location(), dir);
                port->setSyntax(*decl);
                port->setAttributes(scope, decl->attributes);
                ports.push_back(port);
                prim->addMember(*port);
            }
            else {
                auto& inputDecl = decl->as<UdpInputPortDeclSyntax>();
                for (auto nameSyntax : inputDecl.names) {
                    auto name = nameSyntax->identifier;
                    auto port = comp.emplace<PrimitivePortSymbol>(comp, name.valueText(),
                                                                  name.location(),
                                                                  PrimitivePortDirection::In);

                    port->setSyntax(*nameSyntax);
                    port->setAttributes(scope, decl->attributes);
                    ports.push_back(port);
                    prim->addMember(*port);
                }
            }
        }

        if (!syntax.body->portDecls.empty())
            scope.addDiag(diag::PrimitiveAnsiMix, syntax.body->portDecls[0]->sourceRange());
    }
    else if (syntax.portList->kind == SyntaxKind::NonAnsiUdpPortList) {
        // In the non-ansi case the port list only gives the ordering, we need to
        // look through the body decls to get the rest of the port info.
        SmallMap<string_view, PrimitivePortSymbol*, 4> portMap;
        for (auto nameSyntax : syntax.portList->as<NonAnsiUdpPortListSyntax>().ports) {
            auto name = nameSyntax->identifier;
            auto port = comp.emplace<PrimitivePortSymbol>(comp, name.valueText(), name.location(),
                                                          PrimitivePortDirection::In);
            ports.push_back(port);
            prim->addMember(*port);
            if (!name.valueText().empty())
                portMap.emplace(name.valueText(), port);
        }

        auto checkDup = [&](auto port, auto nameToken) {
            // If this port already has a syntax node set it's a duplicate declaration.
            if (auto prevSyntax = port->getSyntax()) {
                auto& diag = scope.addDiag(diag::PrimitivePortDup, nameToken.range());
                diag << nameToken.valueText();
                diag.addNote(diag::NotePreviousDefinition, port->location);
            }
        };

        const UdpOutputPortDeclSyntax* regSpecifier = nullptr;
        for (auto decl : syntax.body->portDecls) {
            if (decl->kind == SyntaxKind::UdpOutputPortDecl) {
                auto& outputDecl = decl->as<UdpOutputPortDeclSyntax>();
                if (auto it = portMap.find(outputDecl.name.valueText()); it != portMap.end()) {
                    // Standalone "reg" specifiers should be saved and processed at the
                    // end once we've handled all of the regular declarations.
                    if (outputDecl.reg && !outputDecl.keyword) {
                        if (regSpecifier) {
                            auto& diag = scope.addDiag(diag::PrimitiveRegDup,
                                                       outputDecl.reg.range());
                            diag.addNote(diag::NotePreviousDefinition,
                                         regSpecifier->reg.location());
                        }
                        regSpecifier = &outputDecl;
                        continue;
                    }

                    auto port = it->second;
                    checkDup(port, outputDecl.name);

                    port->direction = PrimitivePortDirection::Out;
                    if (outputDecl.reg)
                        port->direction = PrimitivePortDirection::OutReg;

                    port->location = outputDecl.name.location();
                    port->setSyntax(outputDecl);
                    port->setAttributes(scope, decl->attributes);
                }
                else {
                    auto& diag = scope.addDiag(diag::PrimitivePortUnknown, outputDecl.name.range());
                    diag << outputDecl.name.valueText();
                }
            }
            else {
                auto& inputDecl = decl->as<UdpInputPortDeclSyntax>();
                for (auto nameSyntax : inputDecl.names) {
                    auto name = nameSyntax->identifier;
                    if (auto it = portMap.find(name.valueText()); it != portMap.end()) {
                        auto port = it->second;
                        checkDup(port, name);

                        // Direction is already set to In here, so just update
                        // our syntax, location, etc.
                        port->location = name.location();
                        port->setSyntax(*nameSyntax);
                        port->setAttributes(scope, decl->attributes);
                    }
                    else {
                        auto& diag = scope.addDiag(diag::PrimitivePortUnknown, name.range());
                        diag << name.valueText();
                    }
                }
            }
        }

        if (regSpecifier) {
            auto name = regSpecifier->name;
            auto it = portMap.find(name.valueText());
            ASSERT(it != portMap.end());

            auto port = it->second;
            if (port->getSyntax()) {
                if (port->direction == PrimitivePortDirection::OutReg) {
                    checkDup(port, name);
                }
                else if (port->direction == PrimitivePortDirection::In) {
                    auto& diag = scope.addDiag(diag::PrimitiveRegInput, name.range());
                    diag << port->name;
                }
                else {
                    port->direction = PrimitivePortDirection::OutReg;
                }
            }
        }

        for (auto port : ports) {
            if (!port->getSyntax()) {
                auto& diag = scope.addDiag(diag::PrimitivePortMissing, port->location);
                diag << port->name;
            }
        }
    }
    else if (syntax.portList->kind == SyntaxKind::WildcardUdpPortList) {
        // TODO:
    }
    else {
        ASSUME_UNREACHABLE;
    }

    if (ports.size() < 2)
        scope.addDiag(diag::PrimitiveTwoPorts, prim->location);
    else if (ports[0]->direction == PrimitivePortDirection::In)
        scope.addDiag(diag::PrimitiveOutputFirst, ports[0]->location);
    else {
        const ExpressionSyntax* initExpr = nullptr;
        if (ports[0]->direction == PrimitivePortDirection::OutReg) {
            prim->isSequential = true;

            // If the first port is an 'output reg' check if it specifies
            // the initial value inline.
            auto portSyntax = ports[0]->getSyntax();
            if (portSyntax && portSyntax->kind == SyntaxKind::UdpOutputPortDecl) {
                auto& outSyntax = portSyntax->as<UdpOutputPortDeclSyntax>();
                if (outSyntax.initializer)
                    initExpr = outSyntax.initializer->expr;
            }
        }

        // Make sure we have only one output port.
        for (size_t i = 1; i < ports.size(); i++) {
            if (ports[i]->direction != PrimitivePortDirection::In) {
                scope.addDiag(diag::PrimitiveDupOutput, ports[i]->location);
                break;
            }
        }

        // If we have an initial statement check it for correctness.
        if (auto initial = syntax.body->initialStmt) {
            if (!prim->isSequential)
                scope.addDiag(diag::PrimitiveInitialInComb, initial->sourceRange());
            else if (initExpr) {
                auto& diag = scope.addDiag(diag::PrimitiveDupInitial, initial->sourceRange());
                diag.addNote(diag::NotePreviousDefinition, initExpr->getFirstToken().location());
            }
            else {
                initExpr = initial->value;

                auto initialName = initial->name.valueText();
                if (!initialName.empty() && !ports[0]->name.empty() &&
                    initialName != ports[0]->name) {
                    auto& diag = scope.addDiag(diag::PrimitiveWrongInitial, initial->name.range());
                    diag << initialName;
                    diag.addNote(diag::NoteDeclarationHere, ports[0]->location);
                }
            }
        }

        if (initExpr) {
            ASTContext context(scope, LookupLocation::max);
            auto& expr = Expression::bind(*initExpr, context);
            if (!expr.bad()) {
                if (expr.kind == ExpressionKind::IntegerLiteral &&
                    (expr.type->getBitWidth() == 1 || expr.isUnsizedInteger())) {
                    context.eval(expr);
                    if (expr.constant) {
                        auto& val = expr.constant->integer();
                        if (val == 0 || val == 1 ||
                            (val.getBitWidth() == 1 && exactlyEqual(val[0], logic_t::x))) {
                            prim->initVal = expr.constant;
                        }
                    }
                }

                if (!prim->initVal)
                    scope.addDiag(diag::PrimitiveInitVal, expr.sourceRange);
            }
        }
    }

    // TODO: body

    prim->ports = ports.copy(comp);
    return *prim;
}